

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O0

uint gf_div(uint a,uint b)

{
  int local_18;
  int32_t diff;
  uint b_local;
  uint a_local;
  
  if (a == 0) {
    b_local = 0;
  }
  else if (b == 0) {
    b_local = 0xffffffff;
  }
  else {
    local_18 = index_of[a] - index_of[b];
    if (local_18 < 0) {
      local_18 = local_18 + 0xff;
    }
    b_local = alpha_of[local_18];
  }
  return b_local;
}

Assistant:

uint32_t gf_div(uint32_t a, uint32_t b)
{
    int32_t diff;
    if (a == 0)
        return 0; // немного оптимизации не повредит
    if (b == 0)
        return -1;                    // на ноль делить нельзя!
    diff = index_of[a] - index_of[b]; // вычисляем разность индексов
    if (diff < 0)
        diff += GFsize - 1; // приводим разность к модулю GF
    return alpha_of[diff];  // переводим результат в полиномиальную...
                            // ...форму и возвращаем результат
}